

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

vec3 dja::rotate(vec3 *r,vec3 *axis,float_t rad)

{
  float fVar1;
  float fVar2;
  float_t b;
  vec3 vVar3;
  vec3 vVar4;
  vec3 vVar5;
  vec3 vVar6;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  vec3 local_30;
  vec3 local_20;
  
  fVar1 = cosf(rad);
  fVar2 = sinf(rad);
  b = dot(r,axis);
  vVar3 = operator*(axis,b);
  local_20._0_8_ = vVar3._0_8_;
  local_20.z = vVar3.z;
  vVar4 = operator-(r,&local_20);
  local_30._0_8_ = vVar4._0_8_;
  local_30.z = vVar4.z;
  vVar5 = cross(&local_30,axis);
  local_68 = vVar4.x;
  fStack_64 = vVar4.y;
  local_58 = vVar3.x;
  fStack_54 = vVar3.y;
  vVar6.y = (fVar1 * fStack_64 - fVar2 * vVar5.y) + fStack_54;
  vVar6.x = (fVar1 * local_68 - fVar2 * vVar5.x) + local_58;
  vVar6.z = (vVar4.z * fVar1 - vVar5.z * fVar2) + vVar3.z;
  return vVar6;
}

Assistant:

V3 rotate(const V3& r, const V3& axis, const V1 rad) {
    V1 c = cos(rad), s = sin(rad);
    V3 r1 = axis * dot(r, axis);
    V3 r2 = r - r1;
    V3 r3 = cross(r2, axis);

    return c * r2 - s * r3 + r1;
}